

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-util.c
# Opt level: O3

void shuffle(int *arr,wchar_t n)

{
  int iVar1;
  uint32_t uVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  
  if (L'\0' < n) {
    uVar4 = (ulong)(uint)n;
    lVar5 = 0;
    do {
      uVar2 = Rand_div((uint32_t)uVar4);
      iVar3 = uVar2 + (int)lVar5;
      iVar1 = arr[iVar3];
      arr[iVar3] = arr[lVar5];
      arr[lVar5] = iVar1;
      lVar5 = lVar5 + 1;
      uVar4 = uVar4 - 1;
    } while (uVar4 != 0);
  }
  return;
}

Assistant:

void shuffle(int *arr, int n)
{
	int i, j, k;
	for (i = 0; i < n; i++) {
		j = randint0(n - i) + i;
		k = arr[j];
		arr[j] = arr[i];
		arr[i] = k;
	}
}